

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O3

double zabs2(complex<double> z)

{
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  return SQRT(in_XMM0_Qa * in_XMM0_Qa + in_XMM1_Qa * in_XMM1_Qa);
}

Assistant:

double zabs2 ( complex <double> z )

//****************************************************************************80
//
//  Purpose:
//
//    ZABS2 returns the L2 norm of a complex <double>.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    The L2 norm of a complex number is the square root of the sum
//    of the squares of the real and imaginary components.
//
//    ZABS2 ( Z ) = sqrt ( ( real ( Z ) )**2 + ( imaginary ( Z ) )**2 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 January 2011
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, complex <double> Z, the number whose norm is desired.
//
//    Output, float ZABS2, the L2 norm of Z.
//
{
  double value;
  double zi;
  double zr;

  zr = real ( z );
  zi = imag ( z );
  value = sqrt ( zr * zr + zi * zi );

  return value;
}